

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockActualCallTest.cpp
# Opt level: O3

void __thiscall
TEST_GROUP_CppUTestGroupMockCheckedActualCall::setup
          (TEST_GROUP_CppUTestGroupMockCheckedActualCall *this)

{
  MockExpectedCallsList *pMVar1;
  MockFailureReporterForTest *pMVar2;
  
  pMVar1 = (MockExpectedCallsList *)
           operator_new(0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
                        ,0x2b);
  MockExpectedCallsList::MockExpectedCallsList(pMVar1);
  this->emptyList = pMVar1;
  pMVar1 = (MockExpectedCallsList *)
           operator_new(0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
                        ,0x2c);
  MockExpectedCallsList::MockExpectedCallsList(pMVar1);
  this->list = pMVar1;
  pMVar2 = MockFailureReporterForTest::getReporter();
  this->reporter = &pMVar2->super_MockFailureReporter;
  return;
}

Assistant:

void setup() _override
    {
        emptyList = new MockExpectedCallsList;
        list = new MockExpectedCallsList;
        reporter = MockFailureReporterForTest::getReporter();
    }